

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  long lVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  byte bVar25;
  byte bVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [16];
  long lVar34;
  Geometry *geometry;
  ulong uVar35;
  long lVar36;
  byte bVar37;
  ulong uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  vint4 ai_1;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar84;
  float fVar91;
  float fVar92;
  vint4 ai;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar101;
  float fVar102;
  vint4 ai_3;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar103;
  vint4 ai_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  vint4 ai_4;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vint4 ai_6;
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  uint uVar119;
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  ulong local_1368;
  undefined1 local_1350 [16];
  ulong local_1338;
  ulong local_1330;
  ulong local_1328;
  undefined1 (*local_1320) [16];
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  ulong local_1300;
  ulong local_12f8;
  ulong local_12f0;
  long local_12e8;
  ulong local_12e0;
  ulong local_12d8;
  ulong local_12d0;
  ulong local_12c8;
  long local_12c0;
  long local_12b8;
  RTCFilterFunctionNArguments local_12b0;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [16];
  undefined1 local_11d0 [16];
  undefined1 local_11c0 [8];
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  byte local_113f;
  float local_1120 [4];
  float fStack_1110;
  float fStack_110c;
  float fStack_1108;
  float fStack_1104;
  float local_1100 [4];
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  int local_1030;
  int iStack_102c;
  int iStack_1028;
  int iStack_1024;
  undefined1 local_1020 [16];
  undefined1 local_1010 [16];
  undefined1 local_1000 [16];
  undefined1 local_ff0 [16];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  local_1320 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar122 = ZEXT1664(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar123 = ZEXT1664(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar124 = ZEXT1664(auVar41);
  auVar39 = vmulss_avx512f(auVar39,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar40 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar42._0_4_ = auVar39._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  auVar40._4_4_ = auVar40._0_4_;
  auVar40._8_4_ = auVar40._0_4_;
  auVar40._12_4_ = auVar40._0_4_;
  auVar39 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar41._0_4_ = auVar39._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  local_1330 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1338 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_12c8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12d0 = local_1330 ^ 0x10;
  local_12d8 = local_1338 ^ 0x10;
  auVar39 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar125 = ZEXT1664(auVar39);
  local_12e0 = local_12c8 ^ 0x10;
  auVar104._8_4_ = 0x80000000;
  auVar104._0_8_ = 0x8000000080000000;
  auVar104._12_4_ = 0x80000000;
  auVar39 = vxorps_avx512vl(auVar42,auVar104);
  auVar126 = ZEXT1664(auVar39);
  auVar39 = vxorps_avx512vl(auVar40,auVar104);
  auVar127 = ZEXT1664(auVar39);
  auVar39 = vxorps_avx512vl(auVar41,auVar104);
  auVar128 = ZEXT1664(auVar39);
  auVar39 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar129 = ZEXT1664(auVar39);
  local_12f0 = local_1330 >> 2;
  local_12f8 = local_12d0 >> 2;
  local_1300 = local_1338 >> 2;
  local_1308 = local_12d8 >> 2;
  local_1328 = local_12c8 >> 2;
  local_1318 = local_12e0 >> 2;
  auVar39 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar130 = ZEXT1664(auVar39);
  auVar39 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar131 = ZEXT1664(auVar39);
  uVar38 = local_1330;
  uVar31 = local_1338;
  local_1310 = local_1328;
  do {
    do {
      do {
        if (local_1320 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar33 = local_1320 + -1;
        local_1320 = local_1320 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)((long)*pauVar33 + 8));
      local_1368 = *(ulong *)*local_1320;
      pauVar33 = local_1320;
      do {
        if ((local_1368 & 8) == 0) {
          auVar39 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(local_1368 + 0x20 + uVar38),auVar126._0_16_,
                               auVar122._0_16_);
          auVar40 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(local_1368 + 0x20 + uVar31),auVar127._0_16_,
                               auVar123._0_16_);
          auVar39 = vpmaxsd_avx(auVar39,auVar40);
          auVar41 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(local_1368 + 0x20 + local_12c8),
                               auVar128._0_16_,auVar124._0_16_);
          auVar40 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(local_1368 + 0x20 + local_12d0),
                               auVar126._0_16_,auVar122._0_16_);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(local_1368 + 0x20 + local_12d8),
                               auVar127._0_16_,auVar123._0_16_);
          auVar40 = vpminsd_avx(auVar40,auVar42);
          auVar42 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [16])(local_1368 + 0x20 + local_12e0),
                               auVar128._0_16_,auVar124._0_16_);
          auVar41 = vpmaxsd_avx512vl(auVar41,auVar129._0_16_);
          auVar39 = vpmaxsd_avx(auVar39,auVar41);
          auVar41 = vpminsd_avx512vl(auVar42,auVar125._0_16_);
          auVar40 = vpminsd_avx(auVar40,auVar41);
          uVar15 = vpcmpd_avx512vl(auVar39,auVar40,2);
          local_1328 = CONCAT44((int)(local_1368 >> 0x20),(uint)((byte)uVar15 & 0xf));
          _local_11c0 = auVar39;
        }
        local_1320 = pauVar33;
        if ((local_1368 & 8) == 0) {
          if (local_1328 == 0) {
            iVar27 = 4;
          }
          else {
            uVar35 = local_1368 & 0xfffffffffffffff0;
            lVar28 = 0;
            for (uVar32 = local_1328; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
            {
              lVar28 = lVar28 + 1;
            }
            iVar27 = 0;
            uVar32 = local_1328 - 1 & local_1328;
            local_1368 = *(ulong *)(uVar35 + lVar28 * 8);
            if (uVar32 != 0) {
              uVar3 = *(uint *)(local_11c0 + lVar28 * 4);
              lVar28 = 0;
              for (uVar16 = uVar32; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              uVar32 = uVar32 - 1 & uVar32;
              uVar16 = *(ulong *)(uVar35 + lVar28 * 8);
              uVar29 = *(uint *)(local_11c0 + lVar28 * 4);
              if (uVar32 == 0) {
                local_1320 = pauVar33 + 1;
                if (uVar3 < uVar29) {
                  *(ulong *)*pauVar33 = uVar16;
                  *(uint *)((long)*pauVar33 + 8) = uVar29;
                }
                else {
                  *(ulong *)*pauVar33 = local_1368;
                  *(uint *)((long)*pauVar33 + 8) = uVar3;
                  local_1368 = uVar16;
                }
              }
              else {
                auVar39._8_8_ = 0;
                auVar39._0_8_ = local_1368;
                auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar3));
                auVar85._8_8_ = 0;
                auVar85._0_8_ = uVar16;
                auVar40 = vpunpcklqdq_avx(auVar85,ZEXT416(uVar29));
                lVar28 = 0;
                for (uVar16 = uVar32; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
                {
                  lVar28 = lVar28 + 1;
                }
                uVar32 = uVar32 - 1 & uVar32;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = *(ulong *)(uVar35 + lVar28 * 8);
                auVar85 = vpunpcklqdq_avx(auVar86,ZEXT416(*(uint *)(local_11c0 + lVar28 * 4)));
                auVar41 = vpshufd_avx(auVar39,0xaa);
                auVar42 = vpshufd_avx(auVar40,0xaa);
                auVar104 = vpshufd_avx(auVar85,0xaa);
                if (uVar32 == 0) {
                  uVar32 = vpcmpgtd_avx512vl(auVar42,auVar41);
                  uVar32 = uVar32 & 0xf;
                  auVar42 = vpblendmd_avx512vl(auVar40,auVar39);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar43._0_4_ = (uint)bVar11 * auVar42._0_4_ | (uint)!bVar11 * auVar41._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar43._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar41._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar43._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar41._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar43._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar41._12_4_;
                  auVar40 = vmovdqa32_avx512vl(auVar40);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar44._0_4_ = (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar44._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar39._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar44._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar39._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar44._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar39._12_4_;
                  auVar39 = vpshufd_avx(auVar43,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar104,auVar39);
                  uVar32 = uVar32 & 0xf;
                  auVar40 = vpblendmd_avx512vl(auVar85,auVar43);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
                  local_1368 = CONCAT44((uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar39._4_4_,
                                        (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_
                                       );
                  auVar39 = vmovdqa32_avx512vl(auVar85);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar45._0_4_ = (uint)bVar11 * auVar39._0_4_ | !bVar11 * auVar43._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar45._4_4_ = (uint)bVar11 * auVar39._4_4_ | !bVar11 * auVar43._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar45._8_4_ = (uint)bVar11 * auVar39._8_4_ | !bVar11 * auVar43._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar45._12_4_ = (uint)bVar11 * auVar39._12_4_ | !bVar11 * auVar43._12_4_;
                  auVar39 = vpshufd_avx(auVar45,0xaa);
                  auVar40 = vpshufd_avx(auVar44,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar39,auVar40);
                  uVar32 = uVar32 & 0xf;
                  auVar40 = vpblendmd_avx512vl(auVar45,auVar44);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar46._0_4_ = (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar46._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar39._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar46._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar39._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar46._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar39._12_4_;
                  auVar39 = vmovdqa32_avx512vl(auVar45);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar47._0_4_ = (uint)bVar11 * auVar39._0_4_ | !bVar11 * auVar44._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar47._4_4_ = (uint)bVar11 * auVar39._4_4_ | !bVar11 * auVar44._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar47._8_4_ = (uint)bVar11 * auVar39._8_4_ | !bVar11 * auVar44._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar47._12_4_ = (uint)bVar11 * auVar39._12_4_ | !bVar11 * auVar44._12_4_;
                  *pauVar33 = auVar47;
                  pauVar33[1] = auVar46;
                  local_1320 = pauVar33 + 2;
                }
                else {
                  lVar28 = 0;
                  for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                    lVar28 = lVar28 + 1;
                  }
                  uVar3 = *(uint *)(local_11c0 + lVar28 * 4);
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = *(ulong *)(uVar35 + lVar28 * 8);
                  auVar86 = vpunpcklqdq_avx(auVar110,ZEXT416(uVar3));
                  uVar32 = vpcmpgtd_avx512vl(auVar42,auVar41);
                  uVar32 = uVar32 & 0xf;
                  auVar42 = vpblendmd_avx512vl(auVar40,auVar39);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar48._0_4_ = (uint)bVar11 * auVar42._0_4_ | (uint)!bVar11 * auVar41._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar48._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar41._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar48._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar41._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar48._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar41._12_4_;
                  auVar40 = vmovdqa32_avx512vl(auVar40);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar49._0_4_ = (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar49._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar39._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar49._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar39._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar49._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar39._12_4_;
                  auVar98._4_4_ = uVar3;
                  auVar98._0_4_ = uVar3;
                  auVar98._8_4_ = uVar3;
                  auVar98._12_4_ = uVar3;
                  uVar32 = vpcmpgtd_avx512vl(auVar98,auVar104);
                  uVar32 = uVar32 & 0xf;
                  auVar39 = vpblendmd_avx512vl(auVar86,auVar85);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar50._0_4_ = (uint)bVar11 * auVar39._0_4_ | !bVar11 * uVar3;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar50._4_4_ = (uint)bVar11 * auVar39._4_4_ | !bVar11 * uVar3;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar50._8_4_ = (uint)bVar11 * auVar39._8_4_ | !bVar11 * uVar3;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar50._12_4_ = (uint)bVar11 * auVar39._12_4_ | !bVar11 * uVar3;
                  auVar39 = vmovdqa32_avx512vl(auVar86);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar51._0_4_ = (uint)bVar11 * auVar39._0_4_ | (uint)!bVar11 * auVar85._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar51._4_4_ = (uint)bVar11 * auVar39._4_4_ | (uint)!bVar11 * auVar85._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar51._8_4_ = (uint)bVar11 * auVar39._8_4_ | (uint)!bVar11 * auVar85._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar51._12_4_ = (uint)bVar11 * auVar39._12_4_ | (uint)!bVar11 * auVar85._12_4_;
                  auVar39 = vpshufd_avx(auVar51,0xaa);
                  auVar40 = vpshufd_avx(auVar49,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar39,auVar40);
                  uVar32 = uVar32 & 0xf;
                  auVar40 = vpblendmd_avx512vl(auVar51,auVar49);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar52._0_4_ = (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar52._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar39._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar52._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar39._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar52._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar39._12_4_;
                  auVar39 = vmovdqa32_avx512vl(auVar51);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar53._0_4_ = (uint)bVar11 * auVar39._0_4_ | !bVar11 * auVar49._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar53._4_4_ = (uint)bVar11 * auVar39._4_4_ | !bVar11 * auVar49._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar53._8_4_ = (uint)bVar11 * auVar39._8_4_ | !bVar11 * auVar49._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar53._12_4_ = (uint)bVar11 * auVar39._12_4_ | !bVar11 * auVar49._12_4_;
                  auVar39 = vpshufd_avx(auVar50,0xaa);
                  auVar40 = vpshufd_avx(auVar48,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar39,auVar40);
                  uVar32 = uVar32 & 0xf;
                  auVar40 = vpblendmd_avx512vl(auVar50,auVar48);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  bVar9 = (bool)((byte)(uVar32 >> 1) & 1);
                  local_1368 = CONCAT44((uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar39._4_4_,
                                        (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_
                                       );
                  auVar39 = vmovdqa32_avx512vl(auVar50);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar54._0_4_ = (uint)bVar11 * auVar39._0_4_ | !bVar11 * auVar48._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar54._4_4_ = (uint)bVar11 * auVar39._4_4_ | !bVar11 * auVar48._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar54._8_4_ = (uint)bVar11 * auVar39._8_4_ | !bVar11 * auVar48._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar54._12_4_ = (uint)bVar11 * auVar39._12_4_ | !bVar11 * auVar48._12_4_;
                  auVar39 = vpshufd_avx(auVar54,0xaa);
                  auVar40 = vpshufd_avx(auVar52,0xaa);
                  uVar32 = vpcmpgtd_avx512vl(auVar40,auVar39);
                  uVar32 = uVar32 & 0xf;
                  auVar40 = vpblendmd_avx512vl(auVar52,auVar54);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar55._0_4_ = (uint)bVar11 * auVar40._0_4_ | (uint)!bVar11 * auVar39._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar55._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar39._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar55._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar39._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar55._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar39._12_4_;
                  auVar39 = vmovdqa32_avx512vl(auVar52);
                  bVar11 = (bool)((byte)uVar32 & 1);
                  auVar56._0_4_ = (uint)bVar11 * auVar39._0_4_ | !bVar11 * auVar54._0_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar11 * auVar39._4_4_ | !bVar11 * auVar54._4_4_;
                  bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar11 * auVar39._8_4_ | !bVar11 * auVar54._8_4_;
                  bVar11 = SUB81(uVar32 >> 3,0);
                  auVar56._12_4_ = (uint)bVar11 * auVar39._12_4_ | !bVar11 * auVar54._12_4_;
                  *pauVar33 = auVar53;
                  pauVar33[1] = auVar56;
                  pauVar33[2] = auVar55;
                  local_1320 = pauVar33 + 3;
                }
              }
            }
          }
        }
        else {
          iVar27 = 6;
        }
        pauVar33 = local_1320;
      } while (iVar27 == 0);
    } while (iVar27 != 6);
    local_12e8 = (ulong)((uint)local_1368 & 0xf) - 8;
    if (local_12e8 != 0) {
      local_1368 = local_1368 & 0xfffffffffffffff0;
      local_12c0 = 0;
      do {
        lVar28 = local_12c0 * 0x58;
        local_12b8 = local_1368 + lVar28;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = *(ulong *)(local_1368 + 0x20 + lVar28);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(local_1368 + 0x24 + lVar28);
        uVar15 = vpcmpub_avx512vl(auVar76,auVar87,2);
        uVar1 = *(undefined4 *)(local_1368 + 0x38 + lVar28);
        auVar77._4_4_ = uVar1;
        auVar77._0_4_ = uVar1;
        auVar77._8_4_ = uVar1;
        auVar77._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(local_1368 + 0x44 + lVar28);
        auVar88._4_4_ = uVar1;
        auVar88._0_4_ = uVar1;
        auVar88._8_4_ = uVar1;
        auVar88._12_4_ = uVar1;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)(local_12f0 + 0x20 + local_12b8);
        auVar39 = vpmovzxbd_avx(auVar99);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar40 = vfmadd213ps_fma(auVar39,auVar88,auVar77);
        auVar105._8_8_ = 0;
        auVar105._0_8_ = *(ulong *)(local_12f8 + 0x20 + local_12b8);
        auVar39 = vpmovzxbd_avx(auVar105);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar41 = vfmadd213ps_fma(auVar39,auVar88,auVar77);
        uVar1 = *(undefined4 *)(local_1368 + 0x3c + lVar28);
        auVar78._4_4_ = uVar1;
        auVar78._0_4_ = uVar1;
        auVar78._8_4_ = uVar1;
        auVar78._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(local_1368 + 0x48 + lVar28);
        auVar89._4_4_ = uVar1;
        auVar89._0_4_ = uVar1;
        auVar89._8_4_ = uVar1;
        auVar89._12_4_ = uVar1;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = *(ulong *)(local_1300 + 0x20 + local_12b8);
        auVar39 = vpmovzxbd_avx(auVar107);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar42 = vfmadd213ps_fma(auVar39,auVar89,auVar78);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = *(ulong *)(local_1308 + 0x20 + local_12b8);
        auVar39 = vpmovzxbd_avx(auVar108);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar104 = vfmadd213ps_fma(auVar39,auVar89,auVar78);
        uVar1 = *(undefined4 *)(local_1368 + 0x40 + lVar28);
        auVar79._4_4_ = uVar1;
        auVar79._0_4_ = uVar1;
        auVar79._8_4_ = uVar1;
        auVar79._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(local_1368 + 0x4c + lVar28);
        auVar90._4_4_ = uVar1;
        auVar90._0_4_ = uVar1;
        auVar90._8_4_ = uVar1;
        auVar90._12_4_ = uVar1;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = *(ulong *)(local_1310 + 0x20 + local_12b8);
        auVar39 = vpmovzxbd_avx(auVar111);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar85 = vfmadd213ps_fma(auVar39,auVar90,auVar79);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = *(ulong *)(local_1318 + 0x20 + local_12b8);
        auVar39 = vpmovzxbd_avx(auVar112);
        auVar39 = vcvtdq2ps_avx(auVar39);
        auVar86 = vfmadd213ps_fma(auVar39,auVar90,auVar79);
        auVar39 = vfmadd213ps_avx512vl(auVar40,auVar122._0_16_,auVar126._0_16_);
        auVar40 = vfmadd213ps_avx512vl(auVar42,auVar123._0_16_,auVar127._0_16_);
        auVar39 = vpmaxsd_avx(auVar39,auVar40);
        auVar42 = vfmadd213ps_avx512vl(auVar85,auVar124._0_16_,auVar128._0_16_);
        auVar40 = vfmadd213ps_avx512vl(auVar41,auVar122._0_16_,auVar126._0_16_);
        auVar41 = vfmadd213ps_avx512vl(auVar104,auVar123._0_16_,auVar127._0_16_);
        auVar40 = vpminsd_avx(auVar40,auVar41);
        auVar41 = vfmadd213ps_avx512vl(auVar86,auVar124._0_16_,auVar128._0_16_);
        auVar42 = vpmaxsd_avx512vl(auVar42,auVar129._0_16_);
        local_11d0 = vpmaxsd_avx(auVar39,auVar42);
        auVar39 = vpminsd_avx512vl(auVar41,auVar125._0_16_);
        auVar39 = vpminsd_avx(auVar40,auVar39);
        uVar38 = vpcmpd_avx512vl(local_11d0,auVar39,2);
        uVar38 = ((byte)uVar15 & 0xf) & uVar38;
        if ((char)uVar38 != '\0') {
          do {
            lVar28 = 0;
            for (uVar31 = uVar38; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
              lVar28 = lVar28 + 1;
            }
            fVar96 = *(float *)(ray + k * 4 + 0x80);
            if (*(float *)(local_11d0 + lVar28 * 4) <= fVar96) {
              uVar3 = *(uint *)(local_12b8 + 0x50);
              uVar29 = *(uint *)(local_12b8 + 4 + lVar28 * 8);
              pGVar5 = (context->scene->geometries).items[uVar3].ptr;
              lVar6 = *(long *)&pGVar5->field_0x58;
              lVar7 = *(long *)&pGVar5[1].time_range.upper;
              lVar30 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       (ulong)uVar29;
              uVar31 = *(ulong *)(local_12b8 + lVar28 * 8);
              auVar80._8_8_ = 0;
              auVar80._0_8_ = uVar31;
              auVar39 = vpandq_avx512vl(auVar80,auVar130._0_16_);
              auVar85 = vpmovzxwd_avx(auVar39);
              auVar100._8_8_ = 0;
              auVar100._0_8_ = *(ulong *)(lVar6 + lVar30);
              auVar39 = vpaddd_avx(auVar100,auVar85);
              auVar40 = vpmulld_avx(auVar100,auVar85);
              auVar40 = vpsrlq_avx(auVar40,0x20);
              auVar39 = vpaddd_avx(auVar39,auVar40);
              lVar28 = CONCAT44((int)((ulong)context >> 0x20),auVar39._0_4_);
              p_Var8 = pGVar5[1].intersectionFilterN;
              auVar39 = *(undefined1 (*) [16])(lVar7 + (lVar28 + 1) * (long)p_Var8);
              uVar35 = *(ulong *)(lVar6 + lVar30) >> 0x20;
              lVar34 = lVar28 + uVar35 + 1;
              auVar40 = *(undefined1 (*) [16])(lVar7 + (lVar28 + uVar35) * (long)p_Var8);
              auVar41 = *(undefined1 (*) [16])(lVar7 + lVar34 * (long)p_Var8);
              uVar32 = (ulong)(-1 < (short)uVar31);
              auVar42 = *(undefined1 (*) [16])(lVar7 + (lVar28 + uVar32 + 1) * (long)p_Var8);
              lVar36 = uVar32 + lVar34;
              auVar104 = *(undefined1 (*) [16])(lVar7 + lVar36 * (long)p_Var8);
              uVar32 = 0;
              if (-1 < (short)(uVar31 >> 0x10)) {
                uVar32 = uVar35;
              }
              auVar86 = *(undefined1 (*) [16])(lVar7 + (lVar28 + uVar35 + uVar32) * (long)p_Var8);
              auVar48 = *(undefined1 (*) [16])(lVar7 + (lVar34 + uVar32) * (long)p_Var8);
              auVar68._16_16_ = *(undefined1 (*) [16])(lVar7 + (uVar32 + lVar36) * (long)p_Var8);
              auVar68._0_16_ = auVar41;
              auVar50 = vunpcklps_avx(auVar39,auVar104);
              auVar49 = vunpckhps_avx(auVar39,auVar104);
              auVar51 = vunpcklps_avx(auVar42,auVar41);
              auVar42 = vunpckhps_avx(auVar42,auVar41);
              auVar52 = vunpcklps_avx(auVar49,auVar42);
              auVar53 = vunpcklps_avx(auVar50,auVar51);
              auVar42 = vunpckhps_avx(auVar50,auVar51);
              auVar50 = vunpcklps_avx(auVar40,auVar48);
              auVar49 = vunpckhps_avx(auVar40,auVar48);
              auVar51 = vunpcklps_avx(auVar41,auVar86);
              auVar86 = vunpckhps_avx(auVar41,auVar86);
              auVar49 = vunpcklps_avx(auVar49,auVar86);
              auVar54 = vunpcklps_avx(auVar50,auVar51);
              auVar86 = vunpckhps_avx(auVar50,auVar51);
              auVar69._16_16_ = auVar48;
              auVar69._0_16_ = auVar40;
              auVar70._16_16_ = auVar104;
              auVar70._0_16_ = auVar39;
              auVar73 = vunpcklps_avx(auVar70,auVar69);
              auVar71._16_16_ = auVar41;
              auVar71._0_16_ = *(undefined1 (*) [16])(lVar7 + (long)p_Var8 * lVar28);
              auVar72 = vunpcklps_avx(auVar71,auVar68);
              auVar63 = vunpcklps_avx(auVar72,auVar73);
              auVar64 = vunpckhps_avx(auVar72,auVar73);
              auVar73 = vunpckhps_avx(auVar70,auVar69);
              auVar72 = vunpckhps_avx(auVar71,auVar68);
              auVar65 = vunpcklps_avx(auVar72,auVar73);
              auVar73._16_16_ = auVar53;
              auVar73._0_16_ = auVar53;
              auVar72._16_16_ = auVar42;
              auVar72._0_16_ = auVar42;
              auVar58._16_16_ = auVar52;
              auVar58._0_16_ = auVar52;
              auVar62._16_16_ = auVar54;
              auVar62._0_16_ = auVar54;
              auVar114._16_16_ = auVar86;
              auVar114._0_16_ = auVar86;
              auVar67._16_16_ = auVar49;
              auVar67._0_16_ = auVar49;
              auVar73 = vsubps_avx(auVar63,auVar73);
              auVar72 = vsubps_avx(auVar64,auVar72);
              auVar71 = vsubps_avx(auVar65,auVar58);
              auVar70 = vsubps_avx(auVar62,auVar63);
              auVar69 = vsubps_avx(auVar114,auVar64);
              auVar58 = vsubps_avx512vl(auVar67,auVar65);
              auVar59 = vmulps_avx512vl(auVar72,auVar58);
              auVar39 = vfmsub231ps_fma(auVar59,auVar69,auVar71);
              auVar60._4_4_ = auVar71._4_4_ * auVar70._4_4_;
              auVar60._0_4_ = auVar71._0_4_ * auVar70._0_4_;
              auVar60._8_4_ = auVar71._8_4_ * auVar70._8_4_;
              auVar60._12_4_ = auVar71._12_4_ * auVar70._12_4_;
              auVar60._16_4_ = auVar71._16_4_ * auVar70._16_4_;
              auVar60._20_4_ = auVar71._20_4_ * auVar70._20_4_;
              auVar60._24_4_ = auVar71._24_4_ * auVar70._24_4_;
              auVar60._28_4_ = auVar42._12_4_;
              auVar60 = vfmsub231ps_avx512vl(auVar60,auVar58,auVar73);
              auVar66._4_4_ = auVar73._4_4_ * auVar69._4_4_;
              auVar66._0_4_ = auVar73._0_4_ * auVar69._0_4_;
              auVar66._8_4_ = auVar73._8_4_ * auVar69._8_4_;
              auVar66._12_4_ = auVar73._12_4_ * auVar69._12_4_;
              auVar66._16_4_ = auVar73._16_4_ * auVar69._16_4_;
              auVar66._20_4_ = auVar73._20_4_ * auVar69._20_4_;
              auVar66._24_4_ = auVar73._24_4_ * auVar69._24_4_;
              auVar66._28_4_ = auVar52._12_4_;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar115._4_4_ = uVar1;
              auVar115._0_4_ = uVar1;
              auVar115._8_4_ = uVar1;
              auVar115._12_4_ = uVar1;
              auVar115._16_4_ = uVar1;
              auVar115._20_4_ = uVar1;
              auVar115._24_4_ = uVar1;
              auVar115._28_4_ = uVar1;
              auVar61 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
              auVar62 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
              uVar1 = *(undefined4 *)(ray + k * 4);
              auVar59._4_4_ = uVar1;
              auVar59._0_4_ = uVar1;
              auVar59._8_4_ = uVar1;
              auVar59._12_4_ = uVar1;
              auVar59._16_4_ = uVar1;
              auVar59._20_4_ = uVar1;
              auVar59._24_4_ = uVar1;
              auVar59._28_4_ = uVar1;
              auVar59 = vsubps_avx512vl(auVar63,auVar59);
              auVar40 = vfmsub231ps_fma(auVar66,auVar70,auVar72);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
              auVar63._4_4_ = uVar1;
              auVar63._0_4_ = uVar1;
              auVar63._8_4_ = uVar1;
              auVar63._12_4_ = uVar1;
              auVar63._16_4_ = uVar1;
              auVar63._20_4_ = uVar1;
              auVar63._24_4_ = uVar1;
              auVar63._28_4_ = uVar1;
              auVar63 = vsubps_avx512vl(auVar64,auVar63);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar64._4_4_ = uVar1;
              auVar64._0_4_ = uVar1;
              auVar64._8_4_ = uVar1;
              auVar64._12_4_ = uVar1;
              auVar64._16_4_ = uVar1;
              auVar64._20_4_ = uVar1;
              auVar64._24_4_ = uVar1;
              auVar64._28_4_ = uVar1;
              auVar64 = vsubps_avx512vl(auVar65,auVar64);
              auVar65 = vmulps_avx512vl(auVar61,auVar64);
              auVar66 = vfmsub231ps_avx512vl(auVar65,auVar63,auVar62);
              auVar65 = vmulps_avx512vl(auVar62,auVar59);
              auVar67 = vfmsub231ps_avx512vl(auVar65,auVar64,auVar115);
              auVar65 = vmulps_avx512vl(auVar115,auVar63);
              auVar68 = vfmsub231ps_avx512vl(auVar65,auVar59,auVar61);
              auVar65 = vmulps_avx512vl(ZEXT1632(auVar40),auVar62);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar60,auVar61);
              local_1160 = vfmadd231ps_avx512vl(auVar65,ZEXT1632(auVar39),auVar115);
              auVar65._8_4_ = 0x7fffffff;
              auVar65._0_8_ = 0x7fffffff7fffffff;
              auVar65._12_4_ = 0x7fffffff;
              auVar65._16_4_ = 0x7fffffff;
              auVar65._20_4_ = 0x7fffffff;
              auVar65._24_4_ = 0x7fffffff;
              auVar65._28_4_ = 0x7fffffff;
              vandps_avx512vl(local_1160,auVar65);
              auVar61._8_4_ = 0x80000000;
              auVar61._0_8_ = 0x8000000080000000;
              auVar61._12_4_ = 0x80000000;
              auVar61._16_4_ = 0x80000000;
              auVar61._20_4_ = 0x80000000;
              auVar61._24_4_ = 0x80000000;
              auVar61._28_4_ = 0x80000000;
              vandps_avx512vl(local_1160,auVar61);
              auVar65 = vmulps_avx512vl(auVar58,auVar68);
              auVar69 = vfmadd231ps_avx512vl(auVar65,auVar67,auVar69);
              auVar70 = vfmadd231ps_avx512vl(auVar69,auVar66,auVar70);
              fVar84 = local_1160._0_4_;
              auVar113._0_4_ = (float)((uint)fVar84 ^ auVar70._0_4_);
              fVar91 = local_1160._4_4_;
              auVar113._4_4_ = (float)((uint)fVar91 ^ auVar70._4_4_);
              fVar92 = local_1160._8_4_;
              auVar113._8_4_ = (float)((uint)fVar92 ^ auVar70._8_4_);
              fVar93 = local_1160._12_4_;
              auVar113._12_4_ = (float)((uint)fVar93 ^ auVar70._12_4_);
              fVar116 = local_1160._16_4_;
              auVar113._16_4_ = (float)((uint)fVar116 ^ auVar70._16_4_);
              fVar117 = local_1160._20_4_;
              auVar113._20_4_ = (float)((uint)fVar117 ^ auVar70._20_4_);
              fVar118 = local_1160._24_4_;
              auVar113._24_4_ = (float)((uint)fVar118 ^ auVar70._24_4_);
              uVar119 = local_1160._28_4_;
              auVar113._28_4_ = (float)(uVar119 ^ auVar70._28_4_);
              auVar71 = vmulps_avx512vl(auVar71,auVar68);
              auVar72 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar67);
              auVar73 = vfmadd231ps_avx512vl(auVar72,auVar73,auVar66);
              auVar120._0_4_ = (float)((uint)fVar84 ^ auVar73._0_4_);
              auVar120._4_4_ = (float)((uint)fVar91 ^ auVar73._4_4_);
              auVar120._8_4_ = (float)((uint)fVar92 ^ auVar73._8_4_);
              auVar120._12_4_ = (float)((uint)fVar93 ^ auVar73._12_4_);
              auVar120._16_4_ = (float)((uint)fVar116 ^ auVar73._16_4_);
              auVar120._20_4_ = (float)((uint)fVar117 ^ auVar73._20_4_);
              auVar120._24_4_ = (float)((uint)fVar118 ^ auVar73._24_4_);
              auVar120._28_4_ = (float)(uVar119 ^ auVar73._28_4_);
              uVar15 = vcmpps_avx512vl(auVar113,ZEXT832(0) << 0x20,5);
              uVar12 = vcmpps_avx512vl(auVar120,ZEXT832(0) << 0x20,5);
              uVar13 = vcmpps_avx512vl(local_1160,ZEXT832(0) << 0x20,4);
              auVar121._0_4_ = auVar113._0_4_ + auVar120._0_4_;
              auVar121._4_4_ = auVar113._4_4_ + auVar120._4_4_;
              auVar121._8_4_ = auVar113._8_4_ + auVar120._8_4_;
              auVar121._12_4_ = auVar113._12_4_ + auVar120._12_4_;
              auVar121._16_4_ = auVar113._16_4_ + auVar120._16_4_;
              auVar121._20_4_ = auVar113._20_4_ + auVar120._20_4_;
              auVar121._24_4_ = auVar113._24_4_ + auVar120._24_4_;
              auVar121._28_4_ = auVar113._28_4_ + auVar120._28_4_;
              uVar14 = vcmpps_avx512vl(auVar121,local_1160,2);
              bVar37 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
              if (bVar37 != 0) {
                auVar20._4_4_ = auVar64._4_4_ * auVar40._4_4_;
                auVar20._0_4_ = auVar64._0_4_ * auVar40._0_4_;
                auVar20._8_4_ = auVar64._8_4_ * auVar40._8_4_;
                auVar20._12_4_ = auVar64._12_4_ * auVar40._12_4_;
                auVar20._16_4_ = auVar64._16_4_ * 0.0;
                auVar20._20_4_ = auVar64._20_4_ * 0.0;
                auVar20._24_4_ = auVar64._24_4_ * 0.0;
                auVar20._28_4_ = auVar64._28_4_;
                auVar41 = vfmadd213ps_fma(auVar63,auVar60,auVar20);
                auVar41 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar39),ZEXT1632(auVar41));
                local_1180._0_4_ = (float)((uint)fVar84 ^ auVar41._0_4_);
                local_1180._4_4_ = (float)((uint)fVar91 ^ auVar41._4_4_);
                local_1180._8_4_ = (float)((uint)fVar92 ^ auVar41._8_4_);
                local_1180._12_4_ = (float)((uint)fVar93 ^ auVar41._12_4_);
                local_1180._16_4_ = fVar116;
                local_1180._20_4_ = fVar117;
                local_1180._24_4_ = fVar118;
                local_1180._28_4_ = uVar119;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
                auVar17._4_4_ = uVar1;
                auVar17._0_4_ = uVar1;
                auVar17._8_4_ = uVar1;
                auVar17._12_4_ = uVar1;
                auVar17._16_4_ = uVar1;
                auVar17._20_4_ = uVar1;
                auVar17._24_4_ = uVar1;
                auVar17._28_4_ = uVar1;
                auVar73 = vmulps_avx512vl(local_1160,auVar17);
                auVar21._4_4_ = fVar96 * fVar91;
                auVar21._0_4_ = fVar96 * fVar84;
                auVar21._8_4_ = fVar96 * fVar92;
                auVar21._12_4_ = fVar96 * fVar93;
                auVar21._16_4_ = fVar96 * fVar116;
                auVar21._20_4_ = fVar96 * fVar117;
                auVar21._24_4_ = fVar96 * fVar118;
                auVar21._28_4_ = fVar96;
                uVar15 = vcmpps_avx512vl(local_1180,auVar21,2);
                uVar12 = vcmpps_avx512vl(auVar73,local_1180,1);
                bVar37 = (byte)uVar15 & (byte)uVar12 & bVar37;
                if (bVar37 != 0) {
                  local_113f = bVar37;
                  auVar73 = vsubps_avx(local_1160,auVar120);
                  auVar73 = vblendps_avx(auVar113,auVar73,0xf0);
                  auVar72 = vsubps_avx(local_1160,auVar113);
                  auVar72 = vblendps_avx(auVar120,auVar72,0xf0);
                  local_10c0._0_4_ = auVar39._0_4_ * 1.0;
                  local_10c0._4_4_ = auVar39._4_4_ * 1.0;
                  local_10c0._8_4_ = auVar39._8_4_ * 1.0;
                  local_10c0._12_4_ = auVar39._12_4_ * 1.0;
                  local_10c0._16_4_ = 0x80000000;
                  local_10c0._20_4_ = 0x80000000;
                  local_10c0._24_4_ = 0x80000000;
                  local_10c0._28_4_ = 0;
                  local_10a0._4_4_ = auVar60._4_4_ * 1.0;
                  local_10a0._0_4_ = auVar60._0_4_ * 1.0;
                  local_10a0._8_4_ = auVar60._8_4_ * 1.0;
                  local_10a0._12_4_ = auVar60._12_4_ * 1.0;
                  local_10a0._16_4_ = auVar60._16_4_ * -1.0;
                  local_10a0._20_4_ = auVar60._20_4_ * -1.0;
                  local_10a0._24_4_ = auVar60._24_4_ * -1.0;
                  local_10a0._28_4_ = 0;
                  local_1080._4_4_ = auVar40._4_4_ * 1.0;
                  local_1080._0_4_ = auVar40._0_4_ * 1.0;
                  local_1080._8_4_ = auVar40._8_4_ * 1.0;
                  local_1080._12_4_ = auVar40._12_4_ * 1.0;
                  local_1080._16_4_ = 0x80000000;
                  local_1080._20_4_ = 0x80000000;
                  local_1080._24_4_ = 0x80000000;
                  local_1080._28_4_ = 0;
                  auVar106._8_4_ = 1;
                  auVar106._0_8_ = 0x100000001;
                  auVar106._12_4_ = 1;
                  auVar106._16_4_ = 1;
                  auVar106._20_4_ = 1;
                  auVar106._24_4_ = 1;
                  auVar106._28_4_ = 1;
                  auVar71 = vpermd_avx2(auVar106,ZEXT1632(auVar85));
                  auVar70 = vpaddd_avx2(auVar71,_DAT_0205d4e0);
                  auVar81._0_4_ = auVar85._0_4_;
                  auVar81._4_4_ = auVar81._0_4_;
                  auVar81._8_4_ = auVar81._0_4_;
                  auVar81._12_4_ = auVar81._0_4_;
                  auVar81._16_4_ = auVar81._0_4_;
                  auVar81._20_4_ = auVar81._0_4_;
                  auVar81._24_4_ = auVar81._0_4_;
                  auVar81._28_4_ = auVar81._0_4_;
                  local_1200 = auVar122._0_16_;
                  auVar39 = vcvtsi2ss_avx512f(local_1200,*(ushort *)(lVar6 + 8 + lVar30) - 1);
                  auVar71 = vpaddd_avx2(auVar81,_DAT_0205d4c0);
                  auVar22._12_4_ = 0;
                  auVar22._0_12_ = ZEXT812(0);
                  auVar40 = vrcp14ss_avx512f(auVar22 << 0x20,ZEXT416(auVar39._0_4_));
                  auVar39 = vfnmadd213ss_fma(auVar39,auVar40,SUB6416(ZEXT464(0x40000000),0));
                  fStack_11a8 = auVar40._0_4_ * auVar39._0_4_;
                  auVar39 = vcvtsi2ss_avx512f(local_1200,*(ushort *)(lVar6 + 10 + lVar30) - 1);
                  auVar40 = vrcp14ss_avx512f(auVar22 << 0x20,ZEXT416(auVar39._0_4_));
                  auVar39 = vfnmadd213ss_fma(auVar39,auVar40,SUB6416(ZEXT464(0x40000000),0));
                  fVar96 = auVar40._0_4_ * auVar39._0_4_;
                  auVar71 = vcvtdq2ps_avx(auVar71);
                  fStack_11a4 = auVar71._28_4_ + auVar73._28_4_;
                  local_11c0._0_4_ = (fVar84 * auVar71._0_4_ + auVar73._0_4_) * fStack_11a8;
                  local_11c0._4_4_ = (fVar91 * auVar71._4_4_ + auVar73._4_4_) * fStack_11a8;
                  fStack_11b8 = (fVar92 * auVar71._8_4_ + auVar73._8_4_) * fStack_11a8;
                  fStack_11b4 = (fVar93 * auVar71._12_4_ + auVar73._12_4_) * fStack_11a8;
                  fStack_11b0 = (fVar116 * auVar71._16_4_ + auVar73._16_4_) * fStack_11a8;
                  fStack_11ac = (fVar117 * auVar71._20_4_ + auVar73._20_4_) * fStack_11a8;
                  fStack_11a8 = (fVar118 * auVar71._24_4_ + auVar73._24_4_) * fStack_11a8;
                  auVar73 = vcvtdq2ps_avx(auVar70);
                  fVar84 = (fVar84 * auVar73._0_4_ + auVar72._0_4_) * fVar96;
                  fVar91 = (fVar91 * auVar73._4_4_ + auVar72._4_4_) * fVar96;
                  local_11a0._4_4_ = fVar91;
                  local_11a0._0_4_ = fVar84;
                  fVar92 = (fVar92 * auVar73._8_4_ + auVar72._8_4_) * fVar96;
                  local_11a0._8_4_ = fVar92;
                  fVar93 = (fVar93 * auVar73._12_4_ + auVar72._12_4_) * fVar96;
                  local_11a0._12_4_ = fVar93;
                  fVar94 = (fVar116 * auVar73._16_4_ + auVar72._16_4_) * fVar96;
                  local_11a0._16_4_ = fVar94;
                  fVar95 = (fVar117 * auVar73._20_4_ + auVar72._20_4_) * fVar96;
                  local_11a0._20_4_ = fVar95;
                  fVar96 = (fVar118 * auVar73._24_4_ + auVar72._24_4_) * fVar96;
                  local_11a0._24_4_ = fVar96;
                  local_11a0._28_4_ = auVar73._28_4_ + auVar72._28_4_;
                  if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar73 = vrcp14ps_avx512vl(local_1160);
                    auVar18._8_4_ = 0x3f800000;
                    auVar18._0_8_ = &DAT_3f8000003f800000;
                    auVar18._12_4_ = 0x3f800000;
                    auVar18._16_4_ = 0x3f800000;
                    auVar18._20_4_ = 0x3f800000;
                    auVar18._24_4_ = 0x3f800000;
                    auVar18._28_4_ = 0x3f800000;
                    auVar72 = vfnmadd213ps_avx512vl(local_1160,auVar73,auVar18);
                    auVar39 = vfmadd132ps_fma(auVar72,auVar73,auVar73);
                    fVar97 = auVar39._0_4_;
                    local_10e0._0_4_ = fVar97 * local_1180._0_4_;
                    fVar101 = auVar39._4_4_;
                    local_10e0._4_4_ = fVar101 * local_1180._4_4_;
                    fVar102 = auVar39._8_4_;
                    local_10e0._8_4_ = fVar102 * local_1180._8_4_;
                    fVar103 = auVar39._12_4_;
                    local_10e0._12_4_ = fVar103 * local_1180._12_4_;
                    local_10e0._16_4_ = fVar116 * 0.0;
                    local_10e0._20_4_ = fVar117 * 0.0;
                    local_10e0._24_4_ = fVar118 * 0.0;
                    local_10e0._28_4_ = 0;
                    auVar109 = ZEXT3264(local_10e0);
                    local_1120[0] = (float)local_11c0._0_4_ * fVar97;
                    local_1120[1] = (float)local_11c0._4_4_ * fVar101;
                    local_1120[2] = fStack_11b8 * fVar102;
                    local_1120[3] = fStack_11b4 * fVar103;
                    fStack_1110 = fStack_11b0 * 0.0;
                    fStack_110c = fStack_11ac * 0.0;
                    fStack_1108 = fStack_11a8 * 0.0;
                    fStack_1104 = fStack_11a4;
                    local_1100[0] = fVar84 * fVar97;
                    local_1100[1] = fVar91 * fVar101;
                    local_1100[2] = fVar92 * fVar102;
                    local_1100[3] = fVar93 * fVar103;
                    fStack_10f0 = fVar94 * 0.0;
                    fStack_10ec = fVar95 * 0.0;
                    fStack_10e8 = fVar96 * 0.0;
                    fStack_10e4 = fStack_11a4;
                    auVar82._8_4_ = 0x7f800000;
                    auVar82._0_8_ = 0x7f8000007f800000;
                    auVar82._12_4_ = 0x7f800000;
                    auVar82._16_4_ = 0x7f800000;
                    auVar82._20_4_ = 0x7f800000;
                    auVar82._24_4_ = 0x7f800000;
                    auVar82._28_4_ = 0x7f800000;
                    auVar73 = vblendmps_avx512vl(auVar82,local_10e0);
                    auVar74._0_4_ =
                         (uint)(bVar37 & 1) * auVar73._0_4_ | (uint)!(bool)(bVar37 & 1) * 0x7f800000
                    ;
                    bVar11 = (bool)(bVar37 >> 1 & 1);
                    auVar74._4_4_ = (uint)bVar11 * auVar73._4_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar37 >> 2 & 1);
                    auVar74._8_4_ = (uint)bVar11 * auVar73._8_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar37 >> 3 & 1);
                    auVar74._12_4_ = (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar37 >> 4 & 1);
                    auVar74._16_4_ = (uint)bVar11 * auVar73._16_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar37 >> 5 & 1);
                    auVar74._20_4_ = (uint)bVar11 * auVar73._20_4_ | (uint)!bVar11 * 0x7f800000;
                    bVar11 = (bool)(bVar37 >> 6 & 1);
                    auVar74._24_4_ = (uint)bVar11 * auVar73._24_4_ | (uint)!bVar11 * 0x7f800000;
                    auVar74._28_4_ =
                         (uint)(bVar37 >> 7) * auVar73._28_4_ |
                         (uint)!(bool)(bVar37 >> 7) * 0x7f800000;
                    auVar73 = vshufps_avx(auVar74,auVar74,0xb1);
                    auVar73 = vminps_avx(auVar74,auVar73);
                    auVar72 = vshufpd_avx(auVar73,auVar73,5);
                    auVar73 = vminps_avx(auVar73,auVar72);
                    auVar72 = vpermpd_avx2(auVar73,0x4e);
                    auVar73 = vminps_avx(auVar73,auVar72);
                    uVar15 = vcmpps_avx512vl(auVar74,auVar73,0);
                    bVar25 = (byte)uVar15 & bVar37;
                    if (bVar25 == 0) {
                      bVar25 = bVar37;
                    }
                    uVar31 = 0;
                    for (uVar32 = (ulong)bVar25; (uVar32 & 1) == 0;
                        uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                      uVar31 = uVar31 + 1;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar96 = local_1120[uVar31];
                      fVar84 = local_1100[uVar31];
                      uVar4 = *(undefined4 *)(local_10c0 + uVar31 * 4);
                      uVar1 = *(undefined4 *)(local_10a0 + uVar31 * 4);
                      uVar2 = *(undefined4 *)(local_1080 + uVar31 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10e0 + uVar31 * 4)
                      ;
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = uVar2;
                      *(float *)(ray + k * 4 + 0xf0) = fVar96;
                      *(float *)(ray + k * 4 + 0x100) = fVar84;
                      *(uint *)(ray + k * 4 + 0x110) = uVar29;
                      *(uint *)(ray + k * 4 + 0x120) = uVar3;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      local_11e0 = vpbroadcastd_avx512vl();
                      local_11f0 = vpbroadcastd_avx512vl();
                      local_1060 = local_10e0;
                      local_1210 = auVar123._0_16_;
                      local_1220 = auVar124._0_16_;
                      local_1230 = vmovdqa64_avx512vl(auVar125._0_16_);
                      local_1240 = auVar126._0_16_;
                      local_1250 = auVar127._0_16_;
                      local_1260 = auVar128._0_16_;
                      local_1270 = vmovdqa64_avx512vl(auVar129._0_16_);
                      local_1280 = vmovdqa64_avx512vl(auVar131._0_16_);
                      do {
                        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                        fVar96 = local_1120[uVar31];
                        local_1000._4_4_ = fVar96;
                        local_1000._0_4_ = fVar96;
                        local_1000._8_4_ = fVar96;
                        local_1000._12_4_ = fVar96;
                        fVar96 = local_1100[uVar31];
                        local_ff0._4_4_ = fVar96;
                        local_ff0._0_4_ = fVar96;
                        local_ff0._8_4_ = fVar96;
                        local_ff0._12_4_ = fVar96;
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_10e0 + uVar31 * 4);
                        local_12b0.context = context->user;
                        local_1030 = *(int *)(local_10c0 + uVar31 * 4);
                        uVar2 = *(undefined4 *)(local_10a0 + uVar31 * 4);
                        local_1020._4_4_ = uVar2;
                        local_1020._0_4_ = uVar2;
                        local_1020._8_4_ = uVar2;
                        local_1020._12_4_ = uVar2;
                        uVar2 = *(undefined4 *)(local_1080 + uVar31 * 4);
                        local_1010._4_4_ = uVar2;
                        local_1010._0_4_ = uVar2;
                        local_1010._8_4_ = uVar2;
                        local_1010._12_4_ = uVar2;
                        iStack_102c = local_1030;
                        iStack_1028 = local_1030;
                        iStack_1024 = local_1030;
                        local_fe0 = local_11f0._0_8_;
                        uStack_fd8 = local_11f0._8_8_;
                        local_fd0 = local_11e0;
                        vpcmpeqd_avx2(ZEXT1632(local_11e0),ZEXT1632(local_11e0));
                        uStack_fbc = (local_12b0.context)->instID[0];
                        local_fc0 = uStack_fbc;
                        uStack_fb8 = uStack_fbc;
                        uStack_fb4 = uStack_fbc;
                        uStack_fb0 = (local_12b0.context)->instPrimID[0];
                        uStack_fac = uStack_fb0;
                        uStack_fa8 = uStack_fb0;
                        uStack_fa4 = uStack_fb0;
                        local_1350 = vmovdqa64_avx512vl(auVar131._0_16_);
                        local_12b0.valid = (int *)local_1350;
                        local_12b0.geometryUserPtr = pGVar5->userPtr;
                        local_12b0.hit = (RTCHitN *)&local_1030;
                        local_12b0.N = 4;
                        local_12b0.ray = (RTCRayN *)ray;
                        if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar5->intersectionFilterN)(&local_12b0);
                          auVar109 = ZEXT3264(local_1060);
                          auVar39 = vmovdqa64_avx512vl(local_1280);
                          auVar131 = ZEXT1664(auVar39);
                          auVar39 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                          auVar130 = ZEXT1664(auVar39);
                          auVar39 = vmovdqa64_avx512vl(local_1270);
                          auVar129 = ZEXT1664(auVar39);
                          auVar128 = ZEXT1664(local_1260);
                          auVar127 = ZEXT1664(local_1250);
                          auVar126 = ZEXT1664(local_1240);
                          auVar39 = vmovdqa64_avx512vl(local_1230);
                          auVar125 = ZEXT1664(auVar39);
                          auVar124 = ZEXT1664(local_1220);
                          auVar123 = ZEXT1664(local_1210);
                          auVar122 = ZEXT1664(local_1200);
                        }
                        uVar32 = vptestmd_avx512vl(local_1350,local_1350);
                        if ((uVar32 & 0xf) == 0) {
LAB_007944a4:
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                        }
                        else {
                          p_Var8 = context->args->filter;
                          if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var8)(&local_12b0);
                            auVar109 = ZEXT3264(local_1060);
                            auVar39 = vmovdqa64_avx512vl(local_1280);
                            auVar131 = ZEXT1664(auVar39);
                            auVar39 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                            auVar130 = ZEXT1664(auVar39);
                            auVar39 = vmovdqa64_avx512vl(local_1270);
                            auVar129 = ZEXT1664(auVar39);
                            auVar128 = ZEXT1664(local_1260);
                            auVar127 = ZEXT1664(local_1250);
                            auVar126 = ZEXT1664(local_1240);
                            auVar39 = vmovdqa64_avx512vl(local_1230);
                            auVar125 = ZEXT1664(auVar39);
                            auVar124 = ZEXT1664(local_1220);
                            auVar123 = ZEXT1664(local_1210);
                            auVar122 = ZEXT1664(local_1200);
                          }
                          uVar32 = vptestmd_avx512vl(local_1350,local_1350);
                          uVar32 = uVar32 & 0xf;
                          bVar25 = (byte)uVar32;
                          if (bVar25 == 0) goto LAB_007944a4;
                          iVar27 = *(int *)(local_12b0.hit + 4);
                          iVar23 = *(int *)(local_12b0.hit + 8);
                          iVar24 = *(int *)(local_12b0.hit + 0xc);
                          bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar10 = SUB81(uVar32 >> 3,0);
                          *(uint *)(local_12b0.ray + 0xc0) =
                               (uint)(bVar25 & 1) * *(int *)local_12b0.hit |
                               (uint)!(bool)(bVar25 & 1) * *(int *)(local_12b0.ray + 0xc0);
                          *(uint *)(local_12b0.ray + 0xc4) =
                               (uint)bVar11 * iVar27 |
                               (uint)!bVar11 * *(int *)(local_12b0.ray + 0xc4);
                          *(uint *)(local_12b0.ray + 200) =
                               (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(local_12b0.ray + 200);
                          *(uint *)(local_12b0.ray + 0xcc) =
                               (uint)bVar10 * iVar24 |
                               (uint)!bVar10 * *(int *)(local_12b0.ray + 0xcc);
                          iVar27 = *(int *)(local_12b0.hit + 0x14);
                          iVar23 = *(int *)(local_12b0.hit + 0x18);
                          iVar24 = *(int *)(local_12b0.hit + 0x1c);
                          bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar10 = SUB81(uVar32 >> 3,0);
                          *(uint *)(local_12b0.ray + 0xd0) =
                               (uint)(bVar25 & 1) * *(int *)(local_12b0.hit + 0x10) |
                               (uint)!(bool)(bVar25 & 1) * *(int *)(local_12b0.ray + 0xd0);
                          *(uint *)(local_12b0.ray + 0xd4) =
                               (uint)bVar11 * iVar27 |
                               (uint)!bVar11 * *(int *)(local_12b0.ray + 0xd4);
                          *(uint *)(local_12b0.ray + 0xd8) =
                               (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xd8)
                          ;
                          *(uint *)(local_12b0.ray + 0xdc) =
                               (uint)bVar10 * iVar24 |
                               (uint)!bVar10 * *(int *)(local_12b0.ray + 0xdc);
                          iVar27 = *(int *)(local_12b0.hit + 0x24);
                          iVar23 = *(int *)(local_12b0.hit + 0x28);
                          iVar24 = *(int *)(local_12b0.hit + 0x2c);
                          bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar10 = SUB81(uVar32 >> 3,0);
                          *(uint *)(local_12b0.ray + 0xe0) =
                               (uint)(bVar25 & 1) * *(int *)(local_12b0.hit + 0x20) |
                               (uint)!(bool)(bVar25 & 1) * *(int *)(local_12b0.ray + 0xe0);
                          *(uint *)(local_12b0.ray + 0xe4) =
                               (uint)bVar11 * iVar27 |
                               (uint)!bVar11 * *(int *)(local_12b0.ray + 0xe4);
                          *(uint *)(local_12b0.ray + 0xe8) =
                               (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xe8)
                          ;
                          *(uint *)(local_12b0.ray + 0xec) =
                               (uint)bVar10 * iVar24 |
                               (uint)!bVar10 * *(int *)(local_12b0.ray + 0xec);
                          iVar27 = *(int *)(local_12b0.hit + 0x34);
                          iVar23 = *(int *)(local_12b0.hit + 0x38);
                          iVar24 = *(int *)(local_12b0.hit + 0x3c);
                          bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar32 >> 2) & 1);
                          bVar10 = SUB81(uVar32 >> 3,0);
                          *(uint *)(local_12b0.ray + 0xf0) =
                               (uint)(bVar25 & 1) * *(int *)(local_12b0.hit + 0x30) |
                               (uint)!(bool)(bVar25 & 1) * *(int *)(local_12b0.ray + 0xf0);
                          *(uint *)(local_12b0.ray + 0xf4) =
                               (uint)bVar11 * iVar27 |
                               (uint)!bVar11 * *(int *)(local_12b0.ray + 0xf4);
                          *(uint *)(local_12b0.ray + 0xf8) =
                               (uint)bVar9 * iVar23 | (uint)!bVar9 * *(int *)(local_12b0.ray + 0xf8)
                          ;
                          *(uint *)(local_12b0.ray + 0xfc) =
                               (uint)bVar10 * iVar24 |
                               (uint)!bVar10 * *(int *)(local_12b0.ray + 0xfc);
                          auVar39 = *(undefined1 (*) [16])(local_12b0.ray + 0x100);
                          auVar57._0_4_ =
                               (uint)(bVar25 & 1) * *(int *)(local_12b0.hit + 0x40) |
                               (uint)!(bool)(bVar25 & 1) * auVar39._0_4_;
                          bVar11 = (bool)((byte)(uVar32 >> 1) & 1);
                          auVar57._4_4_ =
                               (uint)bVar11 * *(int *)(local_12b0.hit + 0x44) |
                               (uint)!bVar11 * auVar39._4_4_;
                          bVar11 = (bool)((byte)(uVar32 >> 2) & 1);
                          auVar57._8_4_ =
                               (uint)bVar11 * *(int *)(local_12b0.hit + 0x48) |
                               (uint)!bVar11 * auVar39._8_4_;
                          bVar11 = SUB81(uVar32 >> 3,0);
                          auVar57._12_4_ =
                               (uint)bVar11 * *(int *)(local_12b0.hit + 0x4c) |
                               (uint)!bVar11 * auVar39._12_4_;
                          *(undefined1 (*) [16])(local_12b0.ray + 0x100) = auVar57;
                          auVar39 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x50)
                                                      );
                          *(undefined1 (*) [16])(local_12b0.ray + 0x110) = auVar39;
                          auVar39 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x60)
                                                      );
                          *(undefined1 (*) [16])(local_12b0.ray + 0x120) = auVar39;
                          auVar39 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x70)
                                                      );
                          *(undefined1 (*) [16])(local_12b0.ray + 0x130) = auVar39;
                          auVar39 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_12b0.hit + 0x80)
                                                      );
                          *(undefined1 (*) [16])(local_12b0.ray + 0x140) = auVar39;
                        }
                        bVar25 = ~(byte)(1 << ((uint)uVar31 & 0x1f)) & bVar37;
                        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                        auVar19._4_4_ = uVar1;
                        auVar19._0_4_ = uVar1;
                        auVar19._8_4_ = uVar1;
                        auVar19._12_4_ = uVar1;
                        auVar19._16_4_ = uVar1;
                        auVar19._20_4_ = uVar1;
                        auVar19._24_4_ = uVar1;
                        auVar19._28_4_ = uVar1;
                        uVar15 = vcmpps_avx512vl(auVar109._0_32_,auVar19,2);
                        bVar37 = bVar25 & (byte)uVar15;
                        if ((bVar25 & (byte)uVar15) != 0) {
                          auVar83._8_4_ = 0x7f800000;
                          auVar83._0_8_ = 0x7f8000007f800000;
                          auVar83._12_4_ = 0x7f800000;
                          auVar83._16_4_ = 0x7f800000;
                          auVar83._20_4_ = 0x7f800000;
                          auVar83._24_4_ = 0x7f800000;
                          auVar83._28_4_ = 0x7f800000;
                          auVar73 = vblendmps_avx512vl(auVar83,auVar109._0_32_);
                          auVar75._0_4_ =
                               (uint)(bVar37 & 1) * auVar73._0_4_ |
                               (uint)!(bool)(bVar37 & 1) * 0x7f800000;
                          bVar11 = (bool)(bVar37 >> 1 & 1);
                          auVar75._4_4_ = (uint)bVar11 * auVar73._4_4_ | (uint)!bVar11 * 0x7f800000;
                          bVar11 = (bool)(bVar37 >> 2 & 1);
                          auVar75._8_4_ = (uint)bVar11 * auVar73._8_4_ | (uint)!bVar11 * 0x7f800000;
                          bVar11 = (bool)(bVar37 >> 3 & 1);
                          auVar75._12_4_ =
                               (uint)bVar11 * auVar73._12_4_ | (uint)!bVar11 * 0x7f800000;
                          bVar11 = (bool)(bVar37 >> 4 & 1);
                          auVar75._16_4_ =
                               (uint)bVar11 * auVar73._16_4_ | (uint)!bVar11 * 0x7f800000;
                          bVar11 = (bool)(bVar37 >> 5 & 1);
                          auVar75._20_4_ =
                               (uint)bVar11 * auVar73._20_4_ | (uint)!bVar11 * 0x7f800000;
                          bVar11 = (bool)(bVar37 >> 6 & 1);
                          auVar75._24_4_ =
                               (uint)bVar11 * auVar73._24_4_ | (uint)!bVar11 * 0x7f800000;
                          auVar75._28_4_ =
                               (uint)(bVar37 >> 7) * auVar73._28_4_ |
                               (uint)!(bool)(bVar37 >> 7) * 0x7f800000;
                          auVar73 = vshufps_avx(auVar75,auVar75,0xb1);
                          auVar73 = vminps_avx(auVar75,auVar73);
                          auVar72 = vshufpd_avx(auVar73,auVar73,5);
                          auVar73 = vminps_avx(auVar73,auVar72);
                          auVar72 = vpermpd_avx2(auVar73,0x4e);
                          auVar73 = vminps_avx(auVar73,auVar72);
                          uVar15 = vcmpps_avx512vl(auVar75,auVar73,0);
                          bVar26 = (byte)uVar15 & bVar37;
                          bVar25 = bVar37;
                          if (bVar26 != 0) {
                            bVar25 = bVar26;
                          }
                          uVar3 = 0;
                          for (uVar29 = (uint)bVar25; (uVar29 & 1) == 0;
                              uVar29 = uVar29 >> 1 | 0x80000000) {
                            uVar3 = uVar3 + 1;
                          }
                          uVar31 = (ulong)uVar3;
                        }
                      } while (bVar37 != 0);
                    }
                  }
                }
              }
            }
            uVar38 = uVar38 - 1 & uVar38;
          } while (uVar38 != 0);
        }
        local_12c0 = local_12c0 + 1;
      } while (local_12c0 != local_12e8);
    }
    auVar39 = vpbroadcastd_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
    auVar125 = ZEXT1664(auVar39);
    uVar38 = local_1330;
    uVar31 = local_1338;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }